

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_end(void)

{
  int iVar1;
  int iVar2;
  rf_vertex_buffer *prVar3;
  long lVar4;
  rf_render_batch *prVar5;
  long local_30;
  rf_int i_2;
  rf_int i_1;
  long lStack_18;
  int add_tex_coords;
  rf_int i;
  int add_colors;
  
  if (((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].v_counter !=
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].c_counter) {
    iVar1 = ((rf__ctx->field_0).current_batch)->vertex_buffers
            [((rf__ctx->field_0).current_batch)->current_buffer].v_counter;
    iVar2 = ((rf__ctx->field_0).current_batch)->vertex_buffers
            [((rf__ctx->field_0).current_batch)->current_buffer].c_counter;
    for (lStack_18 = 0; lStack_18 < iVar1 - iVar2; lStack_18 = lStack_18 + 1) {
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].colors
      [((rf__ctx->field_0).current_batch)->vertex_buffers
       [((rf__ctx->field_0).current_batch)->current_buffer].c_counter << 2] =
           ((rf__ctx->field_0).current_batch)->vertex_buffers
           [((rf__ctx->field_0).current_batch)->current_buffer].colors
           [((rf__ctx->field_0).current_batch)->vertex_buffers
            [((rf__ctx->field_0).current_batch)->current_buffer].c_counter * 4 + -4];
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].colors
      [((rf__ctx->field_0).current_batch)->vertex_buffers
       [((rf__ctx->field_0).current_batch)->current_buffer].c_counter * 4 + 1] =
           ((rf__ctx->field_0).current_batch)->vertex_buffers
           [((rf__ctx->field_0).current_batch)->current_buffer].colors
           [((rf__ctx->field_0).current_batch)->vertex_buffers
            [((rf__ctx->field_0).current_batch)->current_buffer].c_counter * 4 + -3];
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].colors
      [((rf__ctx->field_0).current_batch)->vertex_buffers
       [((rf__ctx->field_0).current_batch)->current_buffer].c_counter * 4 + 2] =
           ((rf__ctx->field_0).current_batch)->vertex_buffers
           [((rf__ctx->field_0).current_batch)->current_buffer].colors
           [((rf__ctx->field_0).current_batch)->vertex_buffers
            [((rf__ctx->field_0).current_batch)->current_buffer].c_counter * 4 + -2];
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].colors
      [((rf__ctx->field_0).current_batch)->vertex_buffers
       [((rf__ctx->field_0).current_batch)->current_buffer].c_counter * 4 + 3] =
           ((rf__ctx->field_0).current_batch)->vertex_buffers
           [((rf__ctx->field_0).current_batch)->current_buffer].colors
           [((rf__ctx->field_0).current_batch)->vertex_buffers
            [((rf__ctx->field_0).current_batch)->current_buffer].c_counter * 4 + -1];
      prVar3 = ((rf__ctx->field_0).current_batch)->vertex_buffers;
      lVar4 = ((rf__ctx->field_0).current_batch)->current_buffer;
      prVar3[lVar4].c_counter = prVar3[lVar4].c_counter + 1;
    }
  }
  if (((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].v_counter !=
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].tc_counter) {
    iVar1 = ((rf__ctx->field_0).current_batch)->vertex_buffers
            [((rf__ctx->field_0).current_batch)->current_buffer].v_counter;
    iVar2 = ((rf__ctx->field_0).current_batch)->vertex_buffers
            [((rf__ctx->field_0).current_batch)->current_buffer].tc_counter;
    for (i_2 = 0; i_2 < iVar1 - iVar2; i_2 = i_2 + 1) {
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].texcoords
      [((rf__ctx->field_0).current_batch)->vertex_buffers
       [((rf__ctx->field_0).current_batch)->current_buffer].tc_counter << 1] = 0.0;
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].texcoords
      [((rf__ctx->field_0).current_batch)->vertex_buffers
       [((rf__ctx->field_0).current_batch)->current_buffer].tc_counter * 2 + 1] = 0.0;
      prVar3 = ((rf__ctx->field_0).current_batch)->vertex_buffers;
      lVar4 = ((rf__ctx->field_0).current_batch)->current_buffer;
      prVar3[lVar4].tc_counter = prVar3[lVar4].tc_counter + 1;
    }
  }
  prVar5 = (rf__ctx->field_0).current_batch;
  prVar5->current_depth = prVar5->current_depth + 5e-05;
  if (((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].elements_count * 4 + -4 <=
      ((rf__ctx->field_0).current_batch)->vertex_buffers
      [((rf__ctx->field_0).current_batch)->current_buffer].v_counter) {
    for (local_30 = (long)(rf__ctx->field_0).stack_counter; -1 < local_30; local_30 = local_30 + -1)
    {
      rf_gfx_pop_matrix();
    }
    rf_gfx_draw();
  }
  return;
}

Assistant:

RF_API void rf_gfx_end()
{
    // Make sure vertex_count is the same for vertices, texcoords, colors and normals
    // NOTE: In OpenGL 1.1, one glColor call can be made for all the subsequent glVertex calls

    // Make sure colors count match vertex count
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter != rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter)
    {
        int add_colors = rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter - rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter;

        for (rf_int i = 0; i < add_colors; i++)
        {
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 4];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 1] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 3];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 2] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 2];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 3] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 1];
            rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter++;
        }
    }

    // Make sure texcoords count match vertex count
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter != rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter)
    {
        int add_tex_coords = rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter - rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter;

        for (rf_int i = 0; i < add_tex_coords; i++)
        {
            rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords[2*rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter] = 0.0f;
            rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords[2*rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter + 1] = 0.0f;
            rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter++;
        }
    }

    // TODO: Make sure normals count match vertex count... if normals support is added in a future... :P

    // NOTE: Depth increment is dependant on rf_gfx_ortho(): z-near and z-far values,
    // as well as depth buffer bit-depth (16bit or 24bit or 32bit)
    // Correct increment formula would be: depthInc = (zfar - znear)/pow(2, bits)
    rf_batch.current_depth += (1.0f/20000.0f);

    // Verify internal buffers limits
    // NOTE: This check is combined with usage of rf_gfx_check_buffer_limit()
    if ((rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter) >= (rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4 - 4))
    {
        // WARNING: If we are between rf_gfx_push_matrix() and rf_gfx_pop_matrix() and we need to force a rf_gfx_draw(),
        // we need to call rf_gfx_pop_matrix() before to recover *rf_ctx->gl_ctx.current_matrix (rf_ctx->gl_ctx.modelview) for the next forced draw call!
        // If we have multiple matrix pushed, it will require "rf_ctx->gl_ctx.stack_counter" pops before launching the draw
        for (rf_int i = rf_ctx.stack_counter; i >= 0; i--) rf_gfx_pop_matrix();
        rf_gfx_draw();
    }
}